

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O0

uint16_t __thiscall
Apple::II::VideoSwitches<Cycles>::get_row_address(VideoSwitches<Cycles> *this,int row)

{
  short sVar1;
  GraphicsMode GVar2;
  int iVar3;
  undefined2 local_32;
  GraphicsMode pixel_mode;
  uint16_t row_address;
  int pixel_row;
  int character_row;
  int row_local;
  VideoSwitches<Cycles> *this_local;
  
  sVar1 = (short)(row >> 6) * 0x28 + (short)((row >> 3 & 7U) << 7);
  GVar2 = graphics_mode(this,row);
  if ((GVar2 == HighRes) || (GVar2 == DoubleHighRes)) {
    iVar3 = video_page(this);
    local_32 = ((short)iVar3 + 1) * 0x2000 + sVar1 + (short)((row & 7U) << 10);
  }
  else {
    iVar3 = video_page(this);
    local_32 = ((short)iVar3 + 1) * 0x400 + sVar1;
  }
  return local_32;
}

Assistant:

uint16_t get_row_address(int row) const {
			const int character_row = row >> 3;
			const int pixel_row = row & 7;
			const uint16_t row_address = uint16_t((character_row >> 3) * 40 + ((character_row&7) << 7));

			const GraphicsMode pixel_mode = graphics_mode(row);
			return ((pixel_mode == GraphicsMode::HighRes) || (pixel_mode == GraphicsMode::DoubleHighRes)) ?
				uint16_t(((video_page()+1) * 0x2000) + row_address + ((pixel_row&7) << 10)) :
				uint16_t(((video_page()+1) * 0x400) + row_address);
		}